

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool SubtractionHelper<unsigned_char,_short,_1>::Subtract(uchar *lhs,short *rhs,uchar *result)

{
  bool bVar1;
  int iVar2;
  undefined1 *in_RDX;
  short *in_RSI;
  byte *in_RDI;
  int32_t tmp;
  undefined4 in_stack_ffffffffffffffd8;
  
  iVar2 = (uint)*in_RDI - (int)*in_RSI;
  bVar1 = SafeCastHelper<unsigned_char,_int,_3>::Cast
                    ((int)in_RDX,(uchar *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
  if (bVar1) {
    *in_RDX = (char)iVar2;
  }
  return bVar1;
}

Assistant:

static bool Subtract( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // both values are 16-bit or less
        // rhs is signed, so could end up increasing or decreasing
        std::int32_t tmp = lhs - rhs;

        if( SafeCastHelper< T, std::int32_t, GetCastMethod< T, std::int32_t >::method >::Cast( tmp, result ) )
        {
            result = (T)tmp;
            return true;
        }

        return false;
    }